

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::noViols(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *tol)

{
  bool bVar1;
  type_conflict5 tVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  
  if (this->theType == ENTER) {
    lVar4 = -1;
    lVar5 = 0;
    while( true ) {
      lVar3 = (long)(this->thecovectors->set).thenum;
      lVar4 = lVar4 + 1;
      bVar1 = lVar3 <= lVar4;
      if (lVar3 <= lVar4) {
        return bVar1;
      }
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems._24_5_ = 0;
      result.m_backend.data._M_elems[7]._1_3_ = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)&((this->theFvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar5),
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)&(((this->theUBbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar5));
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result.m_backend,tol);
      if (tVar2) break;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems._24_5_ = 0;
      result.m_backend.data._M_elems[7]._1_3_ = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)&(((this->theLBbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar5),
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)&((this->theFvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar5));
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result.m_backend,tol);
      lVar5 = lVar5 + 0x38;
      if (tVar2) {
        return bVar1;
      }
    }
    return bVar1;
  }
  lVar4 = -1;
  lVar5 = 0;
  while( true ) {
    lVar4 = lVar4 + 1;
    if ((this->thecovectors->set).thenum <= lVar4) {
      lVar4 = -1;
      lVar5 = 0;
      while( true ) {
        lVar3 = (long)(this->thevectors->set).thenum;
        lVar4 = lVar4 + 1;
        bVar1 = lVar3 <= lVar4;
        if (lVar3 <= lVar4) {
          return bVar1;
        }
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result.m_backend,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&((this->thePvec->
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar5),
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&(((this->theUbound->val).
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar5));
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result.m_backend,tol);
        if (tVar2) break;
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result.m_backend,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&(((this->theLbound->val).
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar5),
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&((this->thePvec->
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar5));
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result.m_backend,tol);
        lVar5 = lVar5 + 0x38;
        if (tVar2) {
          return bVar1;
        }
      }
      return bVar1;
    }
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems._24_5_ = 0;
    result.m_backend.data._M_elems[7]._1_3_ = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,
               (cpp_dec_float<50U,_int,_void> *)
               ((long)&((this->theCoPvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar5),
               (cpp_dec_float<50U,_int,_void> *)
               ((long)&(((this->theCoUbound->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar5));
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result.m_backend,tol);
    if (tVar2) break;
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems._24_5_ = 0;
    result.m_backend.data._M_elems[7]._1_3_ = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,
               (cpp_dec_float<50U,_int,_void> *)
               ((long)&(((this->theCoLbound->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar5),
               (cpp_dec_float<50U,_int,_void> *)
               ((long)&((this->theCoPvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar5));
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result.m_backend,tol);
    lVar5 = lVar5 + 0x38;
    if (tVar2) {
      return false;
    }
  }
  return false;
}

Assistant:

bool SPxSolverBase<R>::noViols(R tol) const
   {
      assert(tol >= R(0.0));

      if(type() == ENTER)
      {
         for(int i = 0; i < dim(); i++)
         {
            if((*theFvec)[i] - theUBbound[i] > tol)
               return false;

            if(theLBbound[i] - (*theFvec)[i] > tol)
               return false;
         }
      }
      else
      {
         assert(type() == LEAVE);

         for(int i = 0; i < dim(); i++)
         {
            if((*theCoPvec)[i] - (*theCoUbound)[i] > tol)
               return false;

            if((*theCoLbound)[i] - (*theCoPvec)[i] > tol)
               return false;
         }

         for(int i = 0; i < coDim(); i++)
         {
            if((*thePvec)[i] - (*theUbound)[i] > tol)
               return false;

            if((*theLbound)[i] - (*thePvec)[i] > tol)
               return false;
         }
      }

      return true;
   }